

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.cpp
# Opt level: O1

void __thiscall chrono::ChLink::ChLink(ChLink *this,ChLink *other)

{
  ChLinkBase::ChLinkBase(&this->super_ChLinkBase,&other->super_ChLinkBase);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChPhysicsItem_00b3dba0;
  this->Body1 = (ChBodyFrame *)0x0;
  this->Body2 = (ChBodyFrame *)0x0;
  (this->react_force).m_data[0] = 0.0;
  (this->react_force).m_data[1] = 0.0;
  (this->react_force).m_data[2] = 0.0;
  (this->react_torque).m_data[0] = 0.0;
  (this->react_torque).m_data[1] = 0.0;
  (this->react_torque).m_data[2] = 0.0;
  if (other != this) {
    (this->react_force).m_data[0] = (other->react_force).m_data[0];
    (this->react_force).m_data[1] = (other->react_force).m_data[1];
    (this->react_force).m_data[2] = (other->react_force).m_data[2];
    (this->react_torque).m_data[0] = (other->react_torque).m_data[0];
    (this->react_torque).m_data[1] = (other->react_torque).m_data[1];
    (this->react_torque).m_data[2] = (other->react_torque).m_data[2];
  }
  return;
}

Assistant:

ChLink::ChLink(const ChLink& other) : ChLinkBase(other) {
    Body1 = NULL;
    Body2 = NULL;

    react_force = other.react_force;
    react_torque = other.react_torque;
}